

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

int mk_wcwidth(wchar_t ucs)

{
  int iVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  eh_frame_hdr *peVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = 1;
  pwVar3 = L" ~";
  while (0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    uVar6 = ~uVar5 + uVar2;
    uVar2 = uVar5;
    if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
      uVar2 = uVar6;
      pwVar3 = pwVar3 + uVar5 * 2 + 2;
    }
  }
  iVar1 = 1;
  if ((pwVar3 != L"") && ((uint)*pwVar3 <= (uint)ucs)) {
    return 1;
  }
  pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_private_table;
  uVar2 = 3;
  while (0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    uVar6 = ~uVar5 + uVar2;
    uVar2 = uVar5;
    if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
      pwVar3 = pwVar3 + uVar5 * 2 + 2;
      uVar2 = uVar6;
    }
  }
  if ((pwVar3 == L"") || ((uint)ucs < (uint)*pwVar3)) {
    pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_nonprint_table;
    uVar2 = 0x17;
    while (0 < (long)uVar2) {
      uVar5 = uVar2 >> 1;
      uVar6 = ~uVar5 + uVar2;
      uVar2 = uVar5;
      if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
        pwVar3 = pwVar3 + uVar5 * 2 + 2;
        uVar2 = uVar6;
      }
    }
    if ((pwVar3 == L"") || ((uint)ucs < (uint)*pwVar3)) {
      pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_combining_table;
      uVar2 = 0x122;
      while (0 < (long)uVar2) {
        uVar5 = uVar2 >> 1;
        uVar6 = ~uVar5 + uVar2;
        uVar2 = uVar5;
        if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
          pwVar3 = pwVar3 + uVar5 * 2 + 2;
          uVar2 = uVar6;
        }
      }
      if ((pwVar3 == (wchar_t *)(anonymous_namespace)::widechar_doublewide_table) ||
         ((uint)ucs < (uint)*pwVar3)) {
        pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_doublewide_table;
        uVar2 = 0x62;
        while (0 < (long)uVar2) {
          uVar5 = uVar2 >> 1;
          uVar6 = ~uVar5 + uVar2;
          uVar2 = uVar5;
          if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
            pwVar3 = pwVar3 + uVar5 * 2 + 2;
            uVar2 = uVar6;
          }
        }
        if ((pwVar3 != (wchar_t *)(anonymous_namespace)::widechar_ambiguous_table) &&
           ((uint)*pwVar3 <= (uint)ucs)) {
          return 2;
        }
        pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_ambiguous_table;
        uVar2 = 0xb4;
        while (0 < (long)uVar2) {
          uVar5 = uVar2 >> 1;
          uVar6 = ~uVar5 + uVar2;
          uVar2 = uVar5;
          if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
            pwVar3 = pwVar3 + uVar5 * 2 + 2;
            uVar2 = uVar6;
          }
        }
        if ((pwVar3 == (wchar_t *)(anonymous_namespace)::widechar_unassigned_table) ||
           ((uint)ucs < (uint)*pwVar3)) {
          pwVar3 = (wchar_t *)(anonymous_namespace)::widechar_unassigned_table;
          uVar2 = 0x2b0;
          while (0 < (long)uVar2) {
            uVar5 = uVar2 >> 1;
            uVar6 = ~uVar5 + uVar2;
            uVar2 = uVar5;
            if ((uint)pwVar3[uVar5 * 2 + 1] < (uint)ucs) {
              pwVar3 = pwVar3 + uVar5 * 2 + 2;
              uVar2 = uVar6;
            }
          }
          if ((pwVar3 != (wchar_t *)(anonymous_namespace)::widechar_widened_table) &&
             ((uint)*pwVar3 <= (uint)ucs)) {
            return 0;
          }
          peVar4 = (eh_frame_hdr *)(anonymous_namespace)::widechar_widened_table;
          uVar2 = 0x22;
          while (0 < (long)uVar2) {
            uVar5 = uVar2 >> 1;
            uVar6 = ~uVar5 + uVar2;
            uVar2 = uVar5;
            if ((uint)peVar4[uVar5 * 2 + 1] < (uint)ucs) {
              peVar4 = peVar4 + uVar5 * 2 + 2;
              uVar2 = uVar6;
            }
          }
          if (peVar4 != &__GNU_EH_FRAME_HDR) {
            iVar1 = 2 - (uint)((uint)ucs < (uint)*peVar4);
          }
        }
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

int mk_wcwidth(wchar_t ucs)
{
    int width = widechar_wcwidth (ucs);

    if (width >= 0)
      return width;

    // Interpret widened characters as 2 chars
    if (width == widechar_widened_in_9)
      return 2;

    // Interpret ambiguous east-asian characters as 1 char
    // This includes accented characters like á or é
    if (width == widechar_ambiguous)
      return 1;

    // All other negative values
    return 0;
}